

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conway-cubes.cpp
# Opt level: O0

hypercube_t<char> *
hypercubify<char>(hypercube_t<char> *__return_storage_ptr__,rect_t<char> *in,size_t N)

{
  reference this;
  cube_t<char> local_40;
  char local_22 [2];
  size_t local_20;
  size_t N_local;
  rect_t<char> *in_local;
  object_t<4UL,_char> *hcube;
  
  local_22[1] = 0;
  local_22[0] = '.';
  local_20 = N;
  N_local = (size_t)in;
  in_local = (rect_t<char> *)__return_storage_ptr__;
  make<4ul,char>(__return_storage_ptr__,N,local_22);
  cubify<char>(&local_40,(rect_t<char> *)N_local,local_20);
  this = std::
         vector<std::vector<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>_>_>_>
         ::operator[](__return_storage_ptr__,local_20 >> 1);
  std::
  vector<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>_>
  ::operator=(this,&local_40);
  std::
  vector<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>_>
  ::~vector(&local_40);
  return __return_storage_ptr__;
}

Assistant:

hypercube_t<T> hypercubify(const rect_t<T>& in, size_t N) {
  auto hcube = make<4>(N, '.');
  hcube[N/2] = cubify<T>(in, N);
  return hcube;
}